

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O1

bool __thiscall
NoMeEdgeCalculator::edgeBetween
          (NoMeEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,int numGCAllowedPos,
          int ct)

{
  bool bVar1;
  bool bVar2;
  NoMeEdgeCalculator *this_00;
  bool bVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  string local_138;
  NoMeEdgeCalculator *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar3 = AlignmentRecord::isStrand1(ap1);
  if (((!bVar3) || (bVar3 = AlignmentRecord::isStrand1(ap2), bVar3)) &&
     ((bVar3 = AlignmentRecord::isStrand1(ap1), bVar3 ||
      (bVar3 = AlignmentRecord::isStrand1(ap2), !bVar3)))) {
    AlignmentRecord::getName_abi_cxx11_(&local_138,ap1);
    lVar4 = std::__cxx11::string::find((char *)&local_138,0x19981e,0);
    bVar3 = true;
    if (lVar4 == -1) {
      AlignmentRecord::getName_abi_cxx11_(&local_50,ap2);
      lVar4 = std::__cxx11::string::find((char *)&local_50,0x19981e,0);
      bVar3 = lVar4 != -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    local_118 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    AlignmentRecord::getCode1_abi_cxx11_(&local_138,ap1);
    bVar2 = false;
    lVar4 = std::__cxx11::string::find((char *)&local_138,0x19b4e0,0);
    bVar6 = true;
    if (lVar4 == -1) {
      AlignmentRecord::getCode1_abi_cxx11_(&local_b0,ap1);
      bVar2 = false;
      lVar5 = std::__cxx11::string::find((char *)&local_b0,0x19b4dd,0);
      bVar1 = false;
      if (lVar5 == -1) {
        AlignmentRecord::getCode2_abi_cxx11_(&local_d0,ap1);
        bVar1 = false;
        lVar5 = std::__cxx11::string::find((char *)&local_d0,0x19b4e0,0);
        if (lVar5 == -1) {
          AlignmentRecord::getCode2_abi_cxx11_(&local_70,ap1);
          lVar5 = std::__cxx11::string::find((char *)&local_70,0x19b4dd,0);
          bVar6 = lVar5 != -1;
          bVar2 = true;
          bVar1 = true;
        }
        else {
          bVar2 = true;
          bVar6 = true;
        }
      }
    }
    else {
      bVar1 = false;
    }
    if ((bVar1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2)) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((bVar2) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((lVar4 == -1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if (bVar6) {
      AlignmentRecord::getCode1_abi_cxx11_(&local_138,ap2);
      bVar2 = false;
      lVar4 = std::__cxx11::string::find((char *)&local_138,0x19b4e0,0);
      bVar6 = true;
      if (lVar4 == -1) {
        AlignmentRecord::getCode1_abi_cxx11_(&local_f0,ap2);
        bVar2 = false;
        lVar5 = std::__cxx11::string::find((char *)&local_f0,0x19b4dd,0);
        bVar1 = false;
        if (lVar5 == -1) {
          AlignmentRecord::getCode2_abi_cxx11_(&local_110,ap2);
          bVar1 = false;
          lVar5 = std::__cxx11::string::find((char *)&local_110,0x19b4e0,0);
          if (lVar5 == -1) {
            AlignmentRecord::getCode2_abi_cxx11_(&local_90,ap2);
            lVar5 = std::__cxx11::string::find((char *)&local_90,0x19b4dd,0);
            bVar6 = lVar5 != -1;
            bVar2 = true;
            bVar1 = true;
          }
          else {
            bVar2 = true;
            bVar6 = true;
          }
        }
      }
      else {
        bVar1 = false;
      }
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2)) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      this_00 = local_118;
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2)) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((lVar4 == -1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if (bVar6) {
        bVar3 = scoreReads(this_00,ap1,ap2,bVar3,numGCAllowedPos,ct);
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool NoMeEdgeCalculator::edgeBetween(const AlignmentRecord & ap1, const AlignmentRecord & ap2, int numGCAllowedPos, int ct) const{
    if (ap1.isStrand1()&& !ap2.isStrand1()) {
        return false;
    }else if (!ap1.isStrand1()&& ap2.isStrand1()) {
        return false;
    }
    bool isClique = false;
    if((ap1.getName().find("Clique")!=std::string::npos)||(ap2.getName().find("Clique")!=std::string::npos)){
        isClique = true;
    }


      //For Ideal Graph. Assumes that the reads have chroma1 or chroma2 written in their names
//    if((ap1.getName().find("chroma1") != std::string::npos && ap2.getName().find("chroma1") != std::string::npos) || (ap1.getName().find("chroma2") != std::string::npos && ap2.getName().find("chroma2") != std::string::npos)){
//        if(((ap1.getCode1().find("C") != std::string::npos) || (ap1.getCode1().find("O") != std::string::npos)) || ((ap1.getCode2().find("C") != std::string::npos) || (ap1.getCode2().find("O") != std::string::npos))){
//            if(((ap2.getCode1().find("C") != std::string::npos) || (ap2.getCode1().find("O") != std::string::npos)) || ((ap2.getCode2().find("C") != std::string::npos) || (ap2.getCode2().find("O") != std::string::npos))){
//                if(scoreReads(ap1,ap2, isClique,numGCAllowedPos,ct)){
//                    return true;
//                }else{
//                    return false;
//                }
//            }else{
//                return false;
//            }
//        }else{
//            return false;
//        }
//    }else{
//        return false;
//    }

    //For normal edge criterion
    if(((ap1.getCode1().find("C") != std::string::npos) || (ap1.getCode1().find("O") != std::string::npos)) || ((ap1.getCode2().find("C") != std::string::npos) || (ap1.getCode2().find("O") != std::string::npos))){
        if(((ap2.getCode1().find("C") != std::string::npos) || (ap2.getCode1().find("O") != std::string::npos)) || ((ap2.getCode2().find("C") != std::string::npos) || (ap2.getCode2().find("O") != std::string::npos))){
            if(scoreReads(ap1,ap2, isClique,numGCAllowedPos,ct)){
                return true;
            }else{
                return false;
            }
        }else{
            return false;
        }
    }else{
        return false;
    }
}